

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

Expr str_insert(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args
               ,int argc)

{
  _Bool _Var1;
  ValueType VVar2;
  size_t index_00;
  anon_union_8_8_707b72ea_for_Expr_1 str_00;
  Expr EVar4;
  Expr EVar5;
  Expr expr;
  Expr expr_00;
  Expr ptr;
  Expr ptr_00;
  Expr expr_01;
  Expr ptr_01;
  Expr expr_02;
  Expr expr_03;
  pString local_a8;
  pString res_str;
  Expr arg_sub;
  size_t index;
  pString str;
  int argc_local;
  Expr *args_local;
  pContext_conflict callContext_local;
  pContext_conflict defContext_local;
  pExecutor exec_local;
  Expr res;
  anon_union_8_8_707b72ea_for_Expr_1 aVar3;
  
  hlp_check_args_count(argc,3,3,"__str-insert");
  EVar4._4_4_ = 0;
  EVar4.type = args->type;
  EVar4.field_1.val_atom = (args->field_1).val_atom;
  EVar4 = exec_eval(exec,callContext,EVar4);
  ptr._4_4_ = 0;
  ptr.type = EVar4.type;
  ptr.field_1.val_atom = EVar4.field_1.val_atom;
  EVar4 = dereference(ptr);
  str_00 = EVar4.field_1;
  expr._4_4_ = 0;
  expr.type = args[1].type;
  expr.field_1.val_atom = args[1].field_1.val_atom;
  EVar4 = exec_eval(exec,callContext,expr);
  ptr_00._4_4_ = 0;
  ptr_00.type = EVar4.type;
  ptr_00.field_1.val_atom = EVar4.field_1.val_atom;
  EVar4 = dereference(ptr_00);
  index_00 = longint_to_long(EVar4.field_1.val_int);
  expr_00._4_4_ = 0;
  expr_00.type = args[2].type;
  expr_00.field_1.val_atom = args[2].field_1.val_atom;
  EVar4 = exec_eval(exec,callContext,expr_00);
  aVar3 = EVar4.field_1;
  VVar2 = EVar4.type;
  expr_01._4_4_ = 0;
  expr_01.type = VVar2;
  expr_01.field_1.val_atom = aVar3.val_atom;
  _Var1 = is_string(expr_01);
  if (_Var1) {
    ptr_01._4_4_ = 0;
    ptr_01.type = VVar2;
    ptr_01.field_1.val_atom = aVar3.val_atom;
    EVar4 = dereference(ptr_01);
    local_a8 = string_insert(str_00.val_str,index_00,EVar4.field_1.val_str);
  }
  else {
    expr_02._4_4_ = 0;
    expr_02.type = VVar2;
    expr_02.field_1.val_atom = aVar3.val_atom;
    _Var1 = is_char(expr_02);
    if (!_Var1) {
      printf("__str-insert: third argument not a string or char\n");
      exit(1);
    }
    arg_sub.type._0_1_ = EVar4.field_1._0_1_;
    local_a8 = string_insert_char(str_00.val_str,index_00,(undefined1)arg_sub.type);
  }
  if ((pString)str_00.val_atom == (pString)0x0) {
    printf("__str-insert: string_insert failed\n");
    exit(1);
  }
  EVar4 = make_string(exec,local_a8);
  EVar5.field_1 = EVar4.field_1;
  EVar5.type = EVar4.type;
  free_string(local_a8);
  expr_03._4_4_ = 0;
  expr_03.type = EVar5.type;
  expr_03.field_1.val_atom = EVar5.field_1.val_atom;
  _Var1 = is_none(expr_03);
  if (!_Var1) {
    EVar5._4_4_ = 0;
    return EVar5;
  }
  printf("__str-insert: make_string failed\n");
  exit(1);
}

Assistant:

BUILTIN_FUNC(str_insert)
{
    hlp_check_args_count(argc, 3, 3, "__str-insert");

    pString str = dereference(EVAL_ARG(0)).val_str;
    size_t index = (size_t) longint_to_long(dereference(EVAL_ARG(1)).val_int);
    Expr arg_sub = EVAL_ARG(2);

    pString res_str;
    if (is_string(arg_sub))
        res_str = string_insert(str, index, dereference(arg_sub).val_str);
    else if (is_char(arg_sub))
        res_str = string_insert_char(str, index, arg_sub.val_char);
    else
    {
        log("__str-insert: third argument not a string or char");
        exit(1);
    }
    if (str == NULL)
    {
        log("__str-insert: string_insert failed");
        exit(1);
    }

    Expr res = make_string(exec, res_str);
    free_string(res_str);
    if (is_none(res))
    {
        log("__str-insert: make_string failed");
        exit(1);
    }
    return res;
}